

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
::has_element(raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
              *this,value_type *elem,size_t hashval)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  ushort uVar4;
  char cVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  __m128i match;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  char cVar11;
  char cVar13;
  char cVar14;
  char cVar15;
  
  if (this->ctrl_ != (ctrl_t *)0x0) {
    uVar2 = this->capacity_;
    if ((uVar2 + 1 & uVar2) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar7 = hashval >> 7;
    auVar9 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar9 = pshuflw(auVar9,auVar9,0);
    uVar6 = 0;
    while( true ) {
      uVar7 = uVar7 & uVar2;
      pcVar1 = this->ctrl_ + uVar7;
      cVar5 = pcVar1[0xf];
      cVar11 = auVar9[0];
      auVar12[0] = -(cVar11 == *pcVar1);
      cVar13 = auVar9[1];
      auVar12[1] = -(cVar13 == pcVar1[1]);
      cVar14 = auVar9[2];
      auVar12[2] = -(cVar14 == pcVar1[2]);
      cVar15 = auVar9[3];
      auVar12[3] = -(cVar15 == pcVar1[3]);
      auVar12[4] = -(cVar11 == pcVar1[4]);
      auVar12[5] = -(cVar13 == pcVar1[5]);
      auVar12[6] = -(cVar14 == pcVar1[6]);
      auVar12[7] = -(cVar15 == pcVar1[7]);
      auVar12[8] = -(cVar11 == pcVar1[8]);
      auVar12[9] = -(cVar13 == pcVar1[9]);
      auVar12[10] = -(cVar14 == pcVar1[10]);
      auVar12[0xb] = -(cVar15 == pcVar1[0xb]);
      auVar12[0xc] = -(cVar11 == pcVar1[0xc]);
      auVar12[0xd] = -(cVar13 == pcVar1[0xd]);
      auVar12[0xe] = -(cVar14 == pcVar1[0xe]);
      auVar12[0xf] = -(cVar15 == cVar5);
      uVar4 = (ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf;
      if (uVar4 != 0) {
        uVar8 = (uint)uVar4;
        do {
          uVar3 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          if (this->slots_[uVar3 + uVar7 & uVar2] == *elem) {
            return true;
          }
          uVar8 = uVar8 - 1 & uVar8;
        } while (uVar8 != 0);
      }
      auVar10[0] = -(*pcVar1 == -0x80);
      auVar10[1] = -(pcVar1[1] == -0x80);
      auVar10[2] = -(pcVar1[2] == -0x80);
      auVar10[3] = -(pcVar1[3] == -0x80);
      auVar10[4] = -(pcVar1[4] == -0x80);
      auVar10[5] = -(pcVar1[5] == -0x80);
      auVar10[6] = -(pcVar1[6] == -0x80);
      auVar10[7] = -(pcVar1[7] == -0x80);
      auVar10[8] = -(pcVar1[8] == -0x80);
      auVar10[9] = -(pcVar1[9] == -0x80);
      auVar10[10] = -(pcVar1[10] == -0x80);
      auVar10[0xb] = -(pcVar1[0xb] == -0x80);
      auVar10[0xc] = -(pcVar1[0xc] == -0x80);
      auVar10[0xd] = -(pcVar1[0xd] == -0x80);
      auVar10[0xe] = -(pcVar1[0xe] == -0x80);
      auVar10[0xf] = -(cVar5 == -0x80);
      if ((((((((((((((((auVar10 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar10 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar10 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar10 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar10 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar10 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar10 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar10 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar10 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar10 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar10 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar10 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar10 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar10 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar5 == -0x80)
      break;
      uVar7 = uVar7 + uVar6 + 0x10;
      uVar6 = uVar6 + 0x10;
      if (uVar2 <= uVar6) {
        __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                      ,0x87c,
                      "bool phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>::has_element(const value_type &__restrict, size_t) const [Policy = phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>]"
                     );
      }
    }
  }
  return false;
}

Assistant:

bool has_element(const value_type& PHMAP_RESTRICT elem, size_t hashval) const {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return false;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::element(slots_ + seq.offset((size_t)i)) ==
                                      elem))
                    return true;
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) return false;
            seq.next();
            assert(seq.getindex() < capacity_ && "full table!");
        }
        return false;
    }